

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

const_iterator * __thiscall
QMultiHash<QByteArray,_QByteArray>::constFindImpl<QByteArray>
          (const_iterator *__return_storage_ptr__,QMultiHash<QByteArray,_QByteArray> *this,
          QByteArray *key)

{
  Bucket BVar1;
  piter it;
  
  if (this->m_size != 0) {
    BVar1 = QHashPrivate::Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::
            findBucket<QByteArray>(this->d,key);
    if ((BVar1.span)->offsets[BVar1.index] != 0xff) {
      it.bucket = BVar1.index | ((long)BVar1.span - (long)this->d->spans) / 0x90 << 7;
      it.d = this->d;
      const_iterator::const_iterator(__return_storage_ptr__,it,(Chain **)0x0);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->i).d = (Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *)0x0;
  (__return_storage_ptr__->i).bucket = 0;
  __return_storage_ptr__->e = (Chain **)0x0;
  return __return_storage_ptr__;
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return constEnd();
        return const_iterator(it.toIterator(d));
    }